

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdppm.c
# Opt level: O0

JDIMENSION get_word_rgb_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  undefined1 uVar1;
  undefined1 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  undefined1 *puVar11;
  long in_RSI;
  long *in_RDI;
  uint temp;
  int ps;
  int aindex;
  int bindex;
  int gindex;
  int rindex;
  uint maxval;
  JDIMENSION col;
  JSAMPLE *rescale;
  U_CHAR *bufferptr;
  JSAMPROW ptr;
  ppm_source_ptr source;
  int local_34;
  undefined1 *local_28;
  long local_20;
  
  lVar9 = *(long *)(in_RSI + 0x48);
  uVar3 = *(uint *)(in_RSI + 0x50);
  iVar4 = rgb_red[*(uint *)((long)in_RDI + 0x3c)];
  iVar5 = rgb_green[*(uint *)((long)in_RDI + 0x3c)];
  iVar6 = rgb_blue[*(uint *)((long)in_RDI + 0x3c)];
  iVar7 = alpha_index[*(uint *)((long)in_RDI + 0x3c)];
  iVar8 = rgb_pixelsize[*(uint *)((long)in_RDI + 0x3c)];
  sVar10 = fread(*(void **)(in_RSI + 0x30),1,*(size_t *)(in_RSI + 0x40),*(FILE **)(in_RSI + 0x18));
  if (sVar10 != *(size_t *)(in_RSI + 0x40)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x2b;
    (**(code **)*in_RDI)(in_RDI);
  }
  local_20 = **(long **)(in_RSI + 0x20);
  local_28 = *(undefined1 **)(in_RSI + 0x30);
  for (local_34 = (int)in_RDI[6]; local_34 != 0; local_34 = local_34 + -1) {
    uVar1 = *local_28;
    uVar2 = local_28[1];
    if (uVar3 < CONCAT11(uVar1,uVar2)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x407;
      (**(code **)*in_RDI)(in_RDI);
    }
    *(undefined1 *)(local_20 + iVar4) = *(undefined1 *)(lVar9 + (ulong)(uint)CONCAT11(uVar1,uVar2));
    uVar1 = local_28[2];
    uVar2 = local_28[3];
    if (uVar3 < CONCAT11(uVar1,uVar2)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x407;
      (**(code **)*in_RDI)(in_RDI);
    }
    *(undefined1 *)(local_20 + iVar5) = *(undefined1 *)(lVar9 + (ulong)(uint)CONCAT11(uVar1,uVar2));
    puVar11 = local_28 + 5;
    uVar1 = local_28[4];
    local_28 = local_28 + 6;
    uVar2 = *puVar11;
    if (uVar3 < CONCAT11(uVar1,uVar2)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x407;
      (**(code **)*in_RDI)(in_RDI);
    }
    *(undefined1 *)(local_20 + iVar6) = *(undefined1 *)(lVar9 + (ulong)(uint)CONCAT11(uVar1,uVar2));
    if (-1 < iVar7) {
      *(undefined1 *)(local_20 + iVar7) = 0xff;
    }
    local_20 = local_20 + iVar8;
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_word_rgb_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading raw-word-format PPM files with any maxval */
{
  ppm_source_ptr source = (ppm_source_ptr)sinfo;
  register JSAMPROW ptr;
  register U_CHAR *bufferptr;
  register JSAMPLE *rescale = source->rescale;
  JDIMENSION col;
  unsigned int maxval = source->maxval;
  register int rindex = rgb_red[cinfo->in_color_space];
  register int gindex = rgb_green[cinfo->in_color_space];
  register int bindex = rgb_blue[cinfo->in_color_space];
  register int aindex = alpha_index[cinfo->in_color_space];
  register int ps = rgb_pixelsize[cinfo->in_color_space];

  if (!ReadOK(source->pub.input_file, source->iobuffer, source->buffer_width))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  ptr = source->pub.buffer[0];
  bufferptr = source->iobuffer;
  for (col = cinfo->image_width; col > 0; col--) {
    register unsigned int temp;
    temp  = UCH(*bufferptr++) << 8;
    temp |= UCH(*bufferptr++);
    if (temp > maxval)
      ERREXIT(cinfo, JERR_PPM_OUTOFRANGE);
    ptr[rindex] = rescale[temp];
    temp  = UCH(*bufferptr++) << 8;
    temp |= UCH(*bufferptr++);
    if (temp > maxval)
      ERREXIT(cinfo, JERR_PPM_OUTOFRANGE);
    ptr[gindex] = rescale[temp];
    temp  = UCH(*bufferptr++) << 8;
    temp |= UCH(*bufferptr++);
    if (temp > maxval)
      ERREXIT(cinfo, JERR_PPM_OUTOFRANGE);
    ptr[bindex] = rescale[temp];
    if (aindex >= 0)
      ptr[aindex] = 0xFF;
    ptr += ps;
  }
  return 1;
}